

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv_socketpair(int type,int protocol,uv_os_sock_t *fds,int flags0,int flags1)

{
  int iVar1;
  uv_os_sock_t in_RAX [2];
  int *piVar2;
  uint uVar3;
  uv_os_sock_t temp [2];
  
  uVar3 = (uint)((flags0 & 0x40U & flags1) != 0);
  temp = in_RAX;
  iVar1 = socketpair(1,uVar3 << 0xb | type | 0x80000,protocol,temp);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    return -*piVar2;
  }
  if (uVar3 == 0 && (type & 0x800U) == 0) {
    if ((flags0 & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl(temp[0],1);
      if (iVar1 != 0) goto LAB_00116f91;
    }
    if ((flags1 & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl(temp[1],1);
      if (iVar1 != 0) {
LAB_00116f91:
        uv__close(temp[0]);
        uv__close(temp[1]);
        return iVar1;
      }
    }
  }
  *(uv_os_sock_t (*) [2])fds = temp;
  return 0;
}

Assistant:

int uv_socketpair(int type, int protocol, uv_os_sock_t fds[2], int flags0, int flags1) {
  uv_os_sock_t temp[2];
  int err;
#if defined(__FreeBSD__) || defined(__linux__)
  int flags;

  flags = type | SOCK_CLOEXEC;
  if ((flags0 & UV_NONBLOCK_PIPE) && (flags1 & UV_NONBLOCK_PIPE))
    flags |= SOCK_NONBLOCK;

  if (socketpair(AF_UNIX, flags, protocol, temp))
    return UV__ERR(errno);

  if (flags & UV_FS_O_NONBLOCK) {
    fds[0] = temp[0];
    fds[1] = temp[1];
    return 0;
  }
#else
  if (socketpair(AF_UNIX, type, protocol, temp))
    return UV__ERR(errno);

  if ((err = uv__cloexec(temp[0], 1)))
    goto fail;
  if ((err = uv__cloexec(temp[1], 1)))
    goto fail;
#endif

  if (flags0 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[0], 1)))
        goto fail;
  if (flags1 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[1], 1)))
      goto fail;

  fds[0] = temp[0];
  fds[1] = temp[1];
  return 0;

fail:
  uv__close(temp[0]);
  uv__close(temp[1]);
  return err;
}